

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

UBool calendar_islamic_cleanup(void)

{
  CalendarAstronomer *this;
  void *in_RSI;
  
  if (gMonthCache != (CalendarCache *)0x0) {
    if (gMonthCache != (CalendarCache *)0x0) {
      (*gMonthCache->_vptr_CalendarCache[1])();
    }
    gMonthCache = (CalendarCache *)0x0;
  }
  this = gIslamicCalendarAstro;
  if (gIslamicCalendarAstro != (CalendarAstronomer *)0x0) {
    if (gIslamicCalendarAstro != (CalendarAstronomer *)0x0) {
      icu_63::CalendarAstronomer::~CalendarAstronomer(gIslamicCalendarAstro);
      icu_63::UMemory::operator_delete((UMemory *)this,in_RSI);
    }
    gIslamicCalendarAstro = (CalendarAstronomer *)0x0;
  }
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool calendar_islamic_cleanup(void) {
    if (gMonthCache) {
        delete gMonthCache;
        gMonthCache = NULL;
    }
    if (gIslamicCalendarAstro) {
        delete gIslamicCalendarAstro;
        gIslamicCalendarAstro = NULL;
    }
    return TRUE;
}